

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int clearDatabasePage(BtShared *pBt,Pgno pgno,int freePageFlag,int *pnChange)

{
  byte bVar1;
  u8 uVar2;
  u8 uVar3;
  ushort uVar4;
  uint uVar5;
  u8 *puVar6;
  int iVar7;
  ulong uVar8;
  MemPage *pPage;
  CellInfo info;
  MemPage *local_50;
  CellInfo local_48;
  
  if (pBt->nPage < pgno) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10734,
                "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
    return 0xb;
  }
  iVar7 = getAndInitPage(pBt,pgno,&local_50,(BtCursor *)0x0,0);
  if (iVar7 != 0) {
    return iVar7;
  }
  if (local_50->bBusy == '\0') {
    local_50->bBusy = '\x01';
    bVar1 = local_50->hdrOffset;
    uVar4 = local_50->nCell;
    iVar7 = 0;
    if (uVar4 != 0) {
      uVar8 = 0;
      do {
        uVar4 = local_50->maskPage;
        uVar2 = local_50->aCellIdx[uVar8 * 2];
        uVar3 = local_50->aCellIdx[uVar8 * 2 + 1];
        puVar6 = local_50->aData;
        if (local_50->leaf == '\0') {
          uVar5 = *(uint *)(puVar6 + (CONCAT11(uVar2,uVar3) & uVar4));
          iVar7 = clearDatabasePage(pBt,uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                        (uVar5 & 0xff00) << 8 | uVar5 << 0x18,1,pnChange);
          if (iVar7 != 0) goto LAB_0013e99c;
        }
        iVar7 = clearCell(local_50,puVar6 + (CONCAT11(uVar2,uVar3) & uVar4),&local_48);
        if (iVar7 != 0) goto LAB_0013e99c;
        uVar8 = uVar8 + 1;
        uVar4 = local_50->nCell;
      } while (uVar8 < uVar4);
    }
    if (local_50->leaf == '\0') {
      uVar5 = *(uint *)(local_50->aData + (ulong)bVar1 + 8);
      iVar7 = clearDatabasePage(pBt,uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8
                                    | uVar5 << 0x18,1,pnChange);
      if (iVar7 != 0) goto LAB_0013e99c;
    }
    else if (pnChange != (int *)0x0) {
      *pnChange = *pnChange + (uint)uVar4;
    }
    if (freePageFlag == 0) {
      iVar7 = sqlite3PagerWrite(local_50->pDbPage);
      if (iVar7 == 0) {
        zeroPage(local_50,local_50->aData[bVar1] | 8);
      }
    }
    else if (iVar7 == 0) {
      iVar7 = freePage2(local_50->pBt,local_50,local_50->pgno);
    }
  }
  else {
    iVar7 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10739,
                "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
  }
LAB_0013e99c:
  local_50->bBusy = '\0';
  if (local_50 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(local_50->pDbPage);
  }
  return iVar7;
}

Assistant:

static int clearDatabasePage(
  BtShared *pBt,           /* The BTree that contains the table */
  Pgno pgno,               /* Page number to clear */
  int freePageFlag,        /* Deallocate page if true */
  int *pnChange            /* Add number of Cells freed to this counter */
){
  MemPage *pPage;
  int rc;
  unsigned char *pCell;
  int i;
  int hdr;
  CellInfo info;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pgno>btreePagecount(pBt) ){
    return SQLITE_CORRUPT_BKPT;
  }
  rc = getAndInitPage(pBt, pgno, &pPage, 0, 0);
  if( rc ) return rc;
  if( pPage->bBusy ){
    rc = SQLITE_CORRUPT_BKPT;
    goto cleardatabasepage_out;
  }
  pPage->bBusy = 1;
  hdr = pPage->hdrOffset;
  for(i=0; i<pPage->nCell; i++){
    pCell = findCell(pPage, i);
    if( !pPage->leaf ){
      rc = clearDatabasePage(pBt, get4byte(pCell), 1, pnChange);
      if( rc ) goto cleardatabasepage_out;
    }
    rc = clearCell(pPage, pCell, &info);
    if( rc ) goto cleardatabasepage_out;
  }
  if( !pPage->leaf ){
    rc = clearDatabasePage(pBt, get4byte(&pPage->aData[hdr+8]), 1, pnChange);
    if( rc ) goto cleardatabasepage_out;
  }else if( pnChange ){
    assert( pPage->intKey || CORRUPT_DB );
    testcase( !pPage->intKey );
    *pnChange += pPage->nCell;
  }
  if( freePageFlag ){
    freePage(pPage, &rc);
  }else if( (rc = sqlite3PagerWrite(pPage->pDbPage))==0 ){
    zeroPage(pPage, pPage->aData[hdr] | PTF_LEAF);
  }

cleardatabasepage_out:
  pPage->bBusy = 0;
  releasePage(pPage);
  return rc;
}